

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

void __thiscall
slang::SourceManager::addDiagnosticDirective
          (SourceManager *this,SourceLocation location,string_view name,DiagnosticSeverity severity)

{
  flat_hash_map<BufferID,_std::vector<DiagnosticDirectiveInfo>_> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  value_type_pointer ppVar4;
  DiagnosticDirectiveInfo *pDVar5;
  int iVar6;
  SourceLocation SVar7;
  ulong uVar8;
  ulong uVar9;
  const_iterator __position;
  uint uVar10;
  ulong hash;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  size_t offset;
  unique_lock<std::shared_mutex> lock;
  locator res;
  try_emplace_args_t local_99;
  BufferID local_98;
  DiagnosticSeverity local_94;
  ulong local_90;
  ulong local_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  unique_lock<std::shared_mutex> local_70;
  locator local_60;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_80._M_str = name._M_str;
  local_80._M_len = name._M_len;
  local_70._M_owns = false;
  local_94 = severity;
  local_70._M_device = &this->mutex;
  std::unique_lock<std::shared_mutex>::lock(&local_70);
  local_70._M_owns = true;
  SVar7 = getFullyExpandedLocImpl<std::unique_lock<std::shared_mutex>_>(this,location,&local_70);
  uVar9 = (ulong)SVar7 >> 0x1c;
  local_98.id = SVar7._0_4_ & 0xfffffff;
  arrays_ = &this->diagDirectives;
  hash = SUB168(ZEXT416(local_98.id) * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(ZEXT416(local_98.id) * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar8 = hash >> ((byte)(this->diagDirectives).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
                         .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar4 = (this->diagDirectives).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
           .arrays.elements_;
  local_88 = (this->diagDirectives).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
             .arrays.groups_size_mask;
  uVar11 = 0;
  uVar13 = uVar8;
  do {
    pgVar2 = (this->diagDirectives).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
             .arrays.groups_ + uVar13;
    local_48 = pgVar2->m[0].n;
    uStack_47 = pgVar2->m[1].n;
    uStack_46 = pgVar2->m[2].n;
    bStack_45 = pgVar2->m[3].n;
    uStack_44 = pgVar2->m[4].n;
    uStack_43 = pgVar2->m[5].n;
    uStack_42 = pgVar2->m[6].n;
    bStack_41 = pgVar2->m[7].n;
    uStack_40 = pgVar2->m[8].n;
    uStack_3f = pgVar2->m[9].n;
    uStack_3e = pgVar2->m[10].n;
    bStack_3d = pgVar2->m[0xb].n;
    uStack_3c = pgVar2->m[0xc].n;
    uStack_3b = pgVar2->m[0xd].n;
    uStack_3a = pgVar2->m[0xe].n;
    bStack_39 = pgVar2->m[0xf].n;
    uVar14 = (uchar)uVar3;
    auVar18[0] = -(local_48 == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 8);
    auVar18[1] = -(uStack_47 == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 0x10);
    auVar18[2] = -(uStack_46 == uVar16);
    bVar17 = (byte)((uint)uVar3 >> 0x18);
    auVar18[3] = -(bStack_45 == bVar17);
    auVar18[4] = -(uStack_44 == uVar14);
    auVar18[5] = -(uStack_43 == uVar15);
    auVar18[6] = -(uStack_42 == uVar16);
    auVar18[7] = -(bStack_41 == bVar17);
    auVar18[8] = -(uStack_40 == uVar14);
    auVar18[9] = -(uStack_3f == uVar15);
    auVar18[10] = -(uStack_3e == uVar16);
    auVar18[0xb] = -(bStack_3d == bVar17);
    auVar18[0xc] = -(uStack_3c == uVar14);
    auVar18[0xd] = -(uStack_3b == uVar15);
    auVar18[0xe] = -(uStack_3a == uVar16);
    auVar18[0xf] = -(bStack_39 == bVar17);
    for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); local_90 = uVar9,
        uVar10 != 0; uVar10 = uVar10 - 1 & uVar10) {
      iVar6 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (local_98.id == *(uint *)((long)&ppVar4[uVar13 * 0xf].first.id + (ulong)(uint)(iVar6 << 5))
         ) {
        local_60.p = (pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                      *)((long)&ppVar4[uVar13 * 0xf].first.id + (ulong)(uint)(iVar6 << 5));
        goto LAB_003139c3;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
    lVar12 = uVar13 + uVar11;
    uVar11 = uVar11 + 1;
    uVar13 = lVar12 + 1U & local_88;
  } while (uVar11 <= local_88);
  if ((this->diagDirectives).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
      .size_ctrl.size <
      (this->diagDirectives).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
    ::nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID>
              (&local_60,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
                *)arrays_,(arrays_type *)arrays_,uVar8,hash,&local_99,&local_98);
    psVar1 = &(this->diagDirectives).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID>
              (&local_60,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
                *)arrays_,hash,&local_99,&local_98);
  }
LAB_003139c3:
  __position._M_current =
       ((local_60.p)->second).
       super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pDVar5 = ((local_60.p)->second).
           super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((__position._M_current == pDVar5) || (pDVar5[-1].offset <= uVar9)) {
    std::
    vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
    ::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
              ((vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
                *)&(local_60.p)->second,&local_80,&local_90,&local_94);
  }
  else {
    uVar13 = (long)pDVar5 - (long)__position._M_current >> 5;
    while (uVar8 = uVar13, 0 < (long)uVar8) {
      uVar13 = uVar8 >> 1;
      if (__position._M_current[uVar13].offset <= uVar9) {
        __position._M_current = __position._M_current + uVar13 + 1;
        uVar13 = ~uVar13 + uVar8;
      }
    }
    std::
    vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
    ::
    _M_emplace_aux<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
              ((vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
                *)&(local_60.p)->second,__position,&local_80,&local_90,&local_94);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_70);
  return;
}

Assistant:

void SourceManager::addDiagnosticDirective(SourceLocation location, std::string_view name,
                                           DiagnosticSeverity severity) {
    std::unique_lock<std::shared_mutex> lock(mutex);
    SourceLocation fileLocation = getFullyExpandedLocImpl(location, lock);

    size_t offset = fileLocation.offset();
    auto& vec = diagDirectives[fileLocation.buffer()];
    if (vec.empty() || offset >= vec.back().offset)
        vec.emplace_back(name, offset, severity);
    else {
        // Keep the list in sorted order. Typically new additions should be at the end,
        // in which case we'll hit the condition above, but just in case we will do the
        // full search and insert here.
        vec.emplace(std::ranges::upper_bound(vec, offset, {}, &DiagnosticDirectiveInfo::offset),
                    name, offset, severity);
    }
}